

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O0

int32_t icu_63::RegexCImpl::split
                  (RegularExpression *regexp,UChar *destBuf,int32_t destCapacity,
                  int32_t *requiredCapacity,UChar **destFields,int32_t destFieldsCapacity,
                  UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t local_10c;
  int32_t local_e4;
  int32_t local_c4;
  int32_t local_9c;
  int local_74;
  int j;
  int32_t t;
  int32_t groupNum;
  UErrorCode tStatus;
  int32_t numCaptureGroups;
  int32_t destIdx;
  int32_t i;
  int64_t inputLen;
  int64_t nextOutputStringStart;
  UText *inputText;
  UChar **ppUStack_38;
  int32_t destFieldsCapacity_local;
  UChar **destFields_local;
  int32_t *requiredCapacity_local;
  UChar *pUStack_20;
  int32_t destCapacity_local;
  UChar *destBuf_local;
  RegularExpression *regexp_local;
  
  inputText._4_4_ = destFieldsCapacity;
  ppUStack_38 = destFields;
  destFields_local = (UChar **)requiredCapacity;
  requiredCapacity_local._4_4_ = destCapacity;
  pUStack_20 = destBuf;
  destBuf_local = (UChar *)regexp;
  RegexMatcher::reset(regexp->fMatcher);
  nextOutputStringStart = *(int64_t *)(*(long *)(destBuf_local + 0x14) + 0x20);
  inputLen = 0;
  _destIdx = *(long *)(*(long *)(destBuf_local + 0x14) + 0x30);
  if (_destIdx == 0) {
    regexp_local._4_4_ = 0;
  }
  else {
    tStatus = U_ZERO_ERROR;
    groupNum = RegexMatcher::groupCount(*(RegexMatcher **)(destBuf_local + 0x14));
    t = 0;
    for (numCaptureGroups = 0; numCaptureGroups < inputText._4_4_ + -1;
        numCaptureGroups = numCaptureGroups + 1) {
      UVar1 = RegexMatcher::find(*(RegexMatcher **)(destBuf_local + 0x14));
      if (UVar1 == '\0') {
        ppUStack_38[numCaptureGroups] = pUStack_20 + tStatus;
        if (requiredCapacity_local._4_4_ - tStatus < 1) {
          local_10c = 0;
        }
        else {
          local_10c = requiredCapacity_local._4_4_ - tStatus;
        }
        iVar2 = utext_extract_63((UText *)nextOutputStringStart,inputLen,_destIdx,
                                 pUStack_20 + tStatus,local_10c,status);
        tStatus = iVar2 + 1 + tStatus;
        local_74 = numCaptureGroups;
        goto LAB_0016c269;
      }
      ppUStack_38[numCaptureGroups] = pUStack_20 + tStatus;
      if (requiredCapacity_local._4_4_ - tStatus < 1) {
        local_c4 = 0;
      }
      else {
        local_c4 = requiredCapacity_local._4_4_ - tStatus;
      }
      iVar2 = utext_extract_63((UText *)nextOutputStringStart,inputLen,
                               *(int64_t *)(*(long *)(destBuf_local + 0x14) + 0x88),
                               pUStack_20 + tStatus,local_c4,&t);
      tStatus = iVar2 + 1 + tStatus;
      if (t == 0xf) {
        t = 0;
      }
      else {
        *status = t;
      }
      inputLen = *(int64_t *)(*(long *)(destBuf_local + 0x14) + 0x90);
      j = 1;
      while ((j <= groupNum && (numCaptureGroups != inputText._4_4_ + -1))) {
        numCaptureGroups = numCaptureGroups + 1;
        ppUStack_38[numCaptureGroups] = pUStack_20 + tStatus;
        t = 0;
        if (requiredCapacity_local._4_4_ - tStatus < 1) {
          local_e4 = 0;
        }
        else {
          local_e4 = requiredCapacity_local._4_4_ - tStatus;
        }
        iVar2 = uregex_group_63((URegularExpression *)destBuf_local,j,ppUStack_38[numCaptureGroups],
                                local_e4,&t);
        tStatus = iVar2 + 1 + tStatus;
        if (t == 0xf) {
          t = 0;
        }
        else {
          *status = t;
        }
        j = j + 1;
      }
      if (inputLen == _destIdx) {
        if (tStatus < requiredCapacity_local._4_4_) {
          pUStack_20[tStatus] = L'\0';
        }
        if (numCaptureGroups < inputText._4_4_ + -1) {
          numCaptureGroups = numCaptureGroups + 1;
        }
        if (tStatus < requiredCapacity_local._4_4_) {
          ppUStack_38[numCaptureGroups] = pUStack_20 + tStatus;
        }
        tStatus = tStatus + U_ILLEGAL_ARGUMENT_ERROR;
        local_74 = numCaptureGroups;
        goto LAB_0016c269;
      }
    }
    local_74 = numCaptureGroups;
    if (inputLen < _destIdx) {
      if (numCaptureGroups != inputText._4_4_ + -1) {
        numCaptureGroups = inputText._4_4_ + -1;
        tStatus = (UErrorCode)((long)ppUStack_38[numCaptureGroups] - (long)*ppUStack_38 >> 1);
      }
      ppUStack_38[numCaptureGroups] = pUStack_20 + tStatus;
      if (requiredCapacity_local._4_4_ - tStatus < 1) {
        local_9c = 0;
      }
      else {
        local_9c = requiredCapacity_local._4_4_ - tStatus;
      }
      iVar2 = utext_extract_63((UText *)nextOutputStringStart,inputLen,_destIdx,pUStack_20 + tStatus
                               ,local_9c,status);
      tStatus = iVar2 + 1 + tStatus;
      local_74 = numCaptureGroups;
    }
LAB_0016c269:
    while (local_74 = local_74 + 1, local_74 < inputText._4_4_) {
      ppUStack_38[local_74] = (UChar *)0x0;
    }
    if (destFields_local != (UChar **)0x0) {
      *(UErrorCode *)destFields_local = tStatus;
    }
    if (requiredCapacity_local._4_4_ < tStatus) {
      *status = U_BUFFER_OVERFLOW_ERROR;
    }
    regexp_local._4_4_ = numCaptureGroups + 1;
  }
  return regexp_local._4_4_;
}

Assistant:

int32_t RegexCImpl::split(RegularExpression     *regexp,
                          UChar                 *destBuf,
                          int32_t                destCapacity,
                          int32_t               *requiredCapacity,
                          UChar                 *destFields[],
                          int32_t                destFieldsCapacity,
                          UErrorCode            *status) {
    //
    // Reset for the input text
    //
    regexp->fMatcher->reset();
    UText *inputText = regexp->fMatcher->fInputText;
    int64_t   nextOutputStringStart = 0;
    int64_t   inputLen = regexp->fMatcher->fInputLength;
    if (inputLen == 0) {
        return 0;
    }

    //
    // Loop through the input text, searching for the delimiter pattern
    //
    int32_t   i;             // Index of the field being processed.
    int32_t   destIdx = 0;   // Next available position in destBuf;
    int32_t   numCaptureGroups = regexp->fMatcher->groupCount();
    UErrorCode  tStatus = U_ZERO_ERROR;   // Want to ignore any buffer overflow errors so that the strings are still counted
    for (i=0; ; i++) {
        if (i>=destFieldsCapacity-1) {
            // There are one or zero output strings left.
            // Fill the last output string with whatever is left from the input, then exit the loop.
            //  ( i will be == destFieldsCapacity if we filled the output array while processing
            //    capture groups of the delimiter expression, in which case we will discard the
            //    last capture group saved in favor of the unprocessed remainder of the
            //    input string.)
            if (inputLen > nextOutputStringStart) {
                if (i != destFieldsCapacity-1) {
                    // No fields are left.  Recycle the last one for holding the trailing part of
                    //   the input string.
                    i = destFieldsCapacity-1;
                    destIdx = (int32_t)(destFields[i] - destFields[0]);
                }

                destFields[i] = &destBuf[destIdx];
                destIdx += 1 + utext_extract(inputText, nextOutputStringStart, inputLen,
                                             &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), status);
            }
            break;
        }

        if (regexp->fMatcher->find()) {
            // We found another delimiter.  Move everything from where we started looking
            //  up until the start of the delimiter into the next output string.
            destFields[i] = &destBuf[destIdx];

            destIdx += 1 + utext_extract(inputText, nextOutputStringStart, regexp->fMatcher->fMatchStart,
                                         &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), &tStatus);
            if (tStatus == U_BUFFER_OVERFLOW_ERROR) {
                tStatus = U_ZERO_ERROR;
            } else {
                *status = tStatus;
            }
            nextOutputStringStart = regexp->fMatcher->fMatchEnd;

            // If the delimiter pattern has capturing parentheses, the captured
            //  text goes out into the next n destination strings.
            int32_t groupNum;
            for (groupNum=1; groupNum<=numCaptureGroups; groupNum++) {
                // If we've run out of output string slots, bail out.
                if (i==destFieldsCapacity-1) {
                    break;
                }
                i++;

                // Set up to extract the capture group contents into the dest buffer.
                destFields[i] = &destBuf[destIdx];
                tStatus = U_ZERO_ERROR;
                int32_t t = uregex_group((URegularExpression*)regexp,
                                         groupNum,
                                         destFields[i],
                                         REMAINING_CAPACITY(destIdx, destCapacity),
                                         &tStatus);
                destIdx += t + 1;    // Record the space used in the output string buffer.
                                     //  +1 for the NUL that terminates the string.
                if (tStatus == U_BUFFER_OVERFLOW_ERROR) {
                    tStatus = U_ZERO_ERROR;
                } else {
                    *status = tStatus;
                }
            }

            if (nextOutputStringStart == inputLen) {
                // The delimiter was at the end of the string.
                // Output an empty string, and then we are done.
                if (destIdx < destCapacity) {
                    destBuf[destIdx] = 0;
                }
                if (i < destFieldsCapacity-1) {
                   ++i;
                }
                if (destIdx < destCapacity) {
                    destFields[i] = destBuf + destIdx;
                }
                ++destIdx;
                break;
            }

        }
        else
        {
            // We ran off the end of the input while looking for the next delimiter.
            // All the remaining text goes into the current output string.
            destFields[i] = &destBuf[destIdx];
            destIdx += 1 + utext_extract(inputText, nextOutputStringStart, inputLen,
                                         &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), status);
            break;
        }
    }

    // Zero out any unused portion of the destFields array
    int j;
    for (j=i+1; j<destFieldsCapacity; j++) {
        destFields[j] = NULL;
    }

    if (requiredCapacity != NULL) {
        *requiredCapacity = destIdx;
    }
    if (destIdx > destCapacity) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }
    return i+1;
}